

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

void __thiscall
TTD::UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::AddArrayLink
          (UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL> *this)

{
  UnorderedArrayListLink *pUVar1;
  SnapRootInfoEntry *pSVar2;
  SnapRootInfoEntry *newBlockData;
  UnorderedArrayListLink *copiedOldBlock;
  UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL> *this_local;
  
  pUVar1 = SlabAllocatorBase<0>::
           SlabAllocateStruct<TTD::UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,512ul>::UnorderedArrayListLink>
                     (this->m_alloc);
  pUVar1->CurrPos = (this->m_inlineHeadBlock).CurrPos;
  pUVar1->EndPos = (this->m_inlineHeadBlock).EndPos;
  pUVar1->BlockData = (this->m_inlineHeadBlock).BlockData;
  pUVar1->Next = (this->m_inlineHeadBlock).Next;
  pSVar2 = SlabAllocatorBase<0>::
           SlabAllocateFixedSizeArray<TTD::NSSnapValues::SnapRootInfoEntry,512ul>(this->m_alloc);
  (this->m_inlineHeadBlock).BlockData = pSVar2;
  (this->m_inlineHeadBlock).CurrPos = pSVar2;
  (this->m_inlineHeadBlock).EndPos = pSVar2 + 0x200;
  (this->m_inlineHeadBlock).Next = pUVar1;
  return;
}

Assistant:

void AddArrayLink()
        {
            UnorderedArrayListLink* copiedOldBlock = this->m_alloc->template SlabAllocateStruct<UnorderedArrayListLink>();
            *copiedOldBlock = this->m_inlineHeadBlock;

            T* newBlockData = this->m_alloc->template SlabAllocateFixedSizeArray<T, allocSize>();

            this->m_inlineHeadBlock.BlockData = newBlockData;
            this->m_inlineHeadBlock.CurrPos = newBlockData;
            this->m_inlineHeadBlock.EndPos = newBlockData + allocSize;

            this->m_inlineHeadBlock.Next = copiedOldBlock;
        }